

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

image_u8 * __thiscall image_u8::crop(image_u8 *this,uint32_t new_width,uint32_t new_height)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  image_u8 local_38;
  
  if ((this->m_width != new_width) || (this->m_height != new_height)) {
    image_u8(&local_38,new_width,new_height);
    uVar4 = this->m_width;
    uVar5 = this->m_height;
    if (uVar4 < new_width) {
      new_width = uVar4;
    }
    if (uVar5 < new_height) {
      new_height = uVar5;
    }
    if (new_height != 0) {
      uVar4 = 0;
      do {
        if (new_width != 0) {
          uVar5 = 0;
          do {
            *(undefined4 *)
             local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
             _M_impl.super__Vector_impl_data._M_start[local_38.m_width * uVar4 + uVar5].m_c =
                 *(undefined4 *)
                  (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->m_width * uVar4 + uVar5].m_c;
            uVar5 = uVar5 + 1;
          } while (new_width != uVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != new_height);
      uVar4 = this->m_width;
      uVar5 = this->m_height;
    }
    this->m_width = local_38.m_width;
    this->m_height = local_38.m_height;
    pcVar1 = (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
         .super__Vector_impl_data._M_start;
    (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    if (pcVar1 != (pointer)0x0) {
      local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_start = pcVar1;
      local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar2;
      local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pcVar3;
      local_38.m_width = uVar4;
      local_38.m_height = uVar5;
      operator_delete(pcVar1,(long)pcVar3 - (long)pcVar1);
    }
  }
  return this;
}

Assistant:

image_u8& crop(uint32_t new_width, uint32_t new_height)
	{
		if ((m_width == new_width) && (m_height == new_height))
			return *this;

		image_u8 new_image(new_width, new_height);

		const uint32_t w = std::min(m_width, new_width);
		const uint32_t h = std::min(m_height, new_height);

		for (uint32_t y = 0; y < h; y++)
			for (uint32_t x = 0; x < w; x++)
				new_image(x, y) = (*this)(x, y);

		return swap(new_image);
	}